

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_aead_encrypt(psa_key_handle_t handle,psa_algorithm_t alg,uint8_t *nonce,size_t nonce_length,
                uint8_t *additional_data,size_t additional_data_length,uint8_t *plaintext,
                size_t plaintext_length,uint8_t *ciphertext,size_t ciphertext_size,
                size_t *ciphertext_length)

{
  uchar *tag;
  psa_status_t pVar1;
  int ret;
  ulong tag_len;
  aead_operation_t operation;
  
  *ciphertext_length = 0;
  pVar1 = psa_aead_setup(&operation,handle,0x100,alg);
  if (pVar1 != 0) {
    return pVar1;
  }
  tag_len = (ulong)operation.tag_length;
  pVar1 = -0x8a;
  if (tag_len + plaintext_length <= ciphertext_size) {
    tag = ciphertext + plaintext_length;
    if (operation.core_alg == 0x6001005) {
      pVar1 = -0x86;
      if ((nonce_length != 0xc) || (operation.tag_length != '\x10')) goto LAB_0011140d;
      ret = mbedtls_chachapoly_encrypt_and_tag
                      (&operation.ctx.chachapoly,plaintext_length,nonce,additional_data,
                       additional_data_length,plaintext,ciphertext,tag);
    }
    else if (operation.core_alg == 0x6401001) {
      ret = mbedtls_ccm_encrypt_and_tag
                      (&operation.ctx.ccm,plaintext_length,nonce,nonce_length,additional_data,
                       additional_data_length,plaintext,ciphertext,tag,tag_len);
    }
    else {
      if (operation.core_alg != 0x6401002) {
        return -0x86;
      }
      ret = mbedtls_gcm_crypt_and_tag
                      (&operation.ctx.gcm,1,plaintext_length,nonce,nonce_length,additional_data,
                       additional_data_length,plaintext,ciphertext,tag_len,tag);
    }
    pVar1 = mbedtls_to_psa_error(ret);
    if ((ciphertext_size != 0) && (pVar1 != 0)) {
      memset(ciphertext,0,ciphertext_size);
    }
  }
LAB_0011140d:
  psa_aead_abort_internal(&operation);
  if (pVar1 == 0) {
    *ciphertext_length = operation.tag_length + plaintext_length;
  }
  return pVar1;
}

Assistant:

psa_status_t psa_aead_encrypt( psa_key_handle_t handle,
                               psa_algorithm_t alg,
                               const uint8_t *nonce,
                               size_t nonce_length,
                               const uint8_t *additional_data,
                               size_t additional_data_length,
                               const uint8_t *plaintext,
                               size_t plaintext_length,
                               uint8_t *ciphertext,
                               size_t ciphertext_size,
                               size_t *ciphertext_length )
{
    psa_status_t status;
    aead_operation_t operation;
    uint8_t *tag;

    *ciphertext_length = 0;

    status = psa_aead_setup( &operation, handle, PSA_KEY_USAGE_ENCRYPT, alg );
    if( status != PSA_SUCCESS )
        return( status );

    /* For all currently supported modes, the tag is at the end of the
     * ciphertext. */
    if( ciphertext_size < ( plaintext_length + operation.tag_length ) )
    {
        status = PSA_ERROR_BUFFER_TOO_SMALL;
        goto exit;
    }
    tag = ciphertext + plaintext_length;

#if defined(MBEDTLS_GCM_C)
    if( operation.core_alg == PSA_ALG_GCM )
    {
        status = mbedtls_to_psa_error(
            mbedtls_gcm_crypt_and_tag( &operation.ctx.gcm,
                                       MBEDTLS_GCM_ENCRYPT,
                                       plaintext_length,
                                       nonce, nonce_length,
                                       additional_data, additional_data_length,
                                       plaintext, ciphertext,
                                       operation.tag_length, tag ) );
    }
    else
#endif /* MBEDTLS_GCM_C */
#if defined(MBEDTLS_CCM_C)
    if( operation.core_alg == PSA_ALG_CCM )
    {
        status = mbedtls_to_psa_error(
            mbedtls_ccm_encrypt_and_tag( &operation.ctx.ccm,
                                         plaintext_length,
                                         nonce, nonce_length,
                                         additional_data,
                                         additional_data_length,
                                         plaintext, ciphertext,
                                         tag, operation.tag_length ) );
    }
    else
#endif /* MBEDTLS_CCM_C */
#if defined(MBEDTLS_CHACHAPOLY_C)
    if( operation.core_alg == PSA_ALG_CHACHA20_POLY1305 )
    {
        if( nonce_length != 12 || operation.tag_length != 16 )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        status = mbedtls_to_psa_error(
            mbedtls_chachapoly_encrypt_and_tag( &operation.ctx.chachapoly,
                                                plaintext_length,
                                                nonce,
                                                additional_data,
                                                additional_data_length,
                                                plaintext,
                                                ciphertext,
                                                tag ) );
    }
    else
#endif /* MBEDTLS_CHACHAPOLY_C */
    {
        return( PSA_ERROR_NOT_SUPPORTED );
    }

    if( status != PSA_SUCCESS && ciphertext_size != 0 )
        memset( ciphertext, 0, ciphertext_size );

exit:
    psa_aead_abort_internal( &operation );
    if( status == PSA_SUCCESS )
        *ciphertext_length = plaintext_length + operation.tag_length;
    return( status );
}